

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

ON__LayerPerViewSettings * __thiscall
ON__LayerExtensions::ViewportSettings
          (ON__LayerExtensions *this,ON_Layer *layer,uchar *layer_m_extension_bits,
          ON_UUID viewport_id,bool bCreate)

{
  uint uVar1;
  ON_ModelComponent *pOVar2;
  ON_ModelComponent *pOVar3;
  ON_ModelComponent *pOVar4;
  ON_ModelComponent *pOVar5;
  ON_ModelComponent *pOVar6;
  ON_ModelComponent *pOVar7;
  ON_ModelComponent *pOVar8;
  ON_ModelComponent *pOVar9;
  ON_ModelComponent *pOVar10;
  ON_ModelComponent *pOVar11;
  ON_ModelComponent *pOVar12;
  ON_ModelComponent *pOVar13;
  ON_ModelComponent *pOVar14;
  ON_ModelComponent *pOVar15;
  ON_ModelComponent *pOVar16;
  ON_ModelComponent *pOVar17;
  bool bVar18;
  ON__LayerExtensions *pOVar19;
  ON__LayerPerViewSettings *this_00;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 local_40;
  uchar auStack_38 [8];
  
  auStack_38 = viewport_id._0_8_;
  local_40 = layer_m_extension_bits;
  bVar18 = ON_UuidIsNil((ON_UUID *)&local_40);
  if (!bVar18) {
    pOVar19 = LayerExtensions((ON_Layer *)this,(uchar *)layer,viewport_id.Data4[0]);
    bVar18 = true;
    if (pOVar19 != (ON__LayerExtensions *)0x0) {
      uVar1 = (pOVar19->m_vp_settings).m_count;
      uVar22 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        layer = (ON_Layer *)(pOVar19->m_vp_settings).m_a;
        uVar20 = uVar22;
        do {
          auVar23[0] = -(*(char *)&(layer->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object
                        == (char)local_40);
          auVar23[1] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 1) == local_40._1_1_);
          auVar23[2] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 2) == local_40._2_1_);
          auVar23[3] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 3) == local_40._3_1_);
          auVar23[4] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 4) == local_40._4_1_);
          auVar23[5] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 5) == local_40._5_1_);
          auVar23[6] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 6) == local_40._6_1_);
          auVar23[7] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 7) == local_40._7_1_);
          auVar23[8] = -(*(uchar *)&(layer->super_ON_ModelComponent).super_ON_Object.m_userdata_list
                        == auStack_38[0]);
          auVar23[9] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                           m_userdata_list + 1) == auStack_38[1]);
          auVar23[10] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                            m_userdata_list + 2) == auStack_38[2]);
          auVar23[0xb] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 3) == auStack_38[3]);
          auVar23[0xc] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 4) == auStack_38[4]);
          auVar23[0xd] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 5) == auStack_38[5]);
          auVar23[0xe] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 6) == auStack_38[6]);
          auVar23[0xf] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 7) == auStack_38[7]);
          if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
            bVar18 = false;
            goto LAB_004c633f;
          }
          layer = (ON_Layer *)&(layer->super_ON_ModelComponent).m_linked_idef_serial_number;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      bVar18 = true;
      if (viewport_id.Data4[0] != false) {
        this_00 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(&pOVar19->m_vp_settings);
        layer = (ON_Layer *)(pOVar19->m_vp_settings).m_a;
        ON__LayerPerViewSettings::SetDefaultValues(this_00);
        *(uchar **)&this_00->m_viewport_id = local_40;
        *&(this_00->m_viewport_id).Data4 = auStack_38;
        ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                  (&pOVar19->m_vp_settings,ON__LayerPerViewSettings::Compare);
        bVar18 = SUB41(uVar1 >> 0x1f,0);
        if (-1 < (int)uVar1) {
          auVar24[0] = -(*(char *)&(layer->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object
                        == (char)local_40);
          auVar24[1] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 1) == local_40._1_1_);
          auVar24[2] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 2) == local_40._2_1_);
          auVar24[3] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 3) == local_40._3_1_);
          auVar24[4] = -(*(Type *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 4) == local_40._4_1_);
          auVar24[5] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 5) == local_40._5_1_);
          auVar24[6] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 6) == local_40._6_1_);
          auVar24[7] = -(*(char *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                          _vptr_ON_Object + 7) == local_40._7_1_);
          auVar24[8] = -(*(uchar *)&(layer->super_ON_ModelComponent).super_ON_Object.m_userdata_list
                        == auStack_38[0]);
          auVar24[9] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                           m_userdata_list + 1) == auStack_38[1]);
          auVar24[10] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                            m_userdata_list + 2) == auStack_38[2]);
          auVar24[0xb] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 3) == auStack_38[3]);
          auVar24[0xc] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 4) == auStack_38[4]);
          auVar24[0xd] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 5) == auStack_38[5]);
          auVar24[0xe] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 6) == auStack_38[6]);
          auVar24[0xf] = -(*(uchar *)((long)&(layer->super_ON_ModelComponent).super_ON_Object.
                                             m_userdata_list + 7) == auStack_38[7]);
          if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
            uVar20 = 0;
            do {
              uVar21 = uVar20;
              if (uVar22 == uVar21) break;
              pOVar2 = &layer->super_ON_ModelComponent;
              pOVar3 = &layer->super_ON_ModelComponent;
              pOVar4 = &layer->super_ON_ModelComponent;
              pOVar5 = &layer->super_ON_ModelComponent;
              pOVar6 = &layer->super_ON_ModelComponent;
              pOVar7 = &layer->super_ON_ModelComponent;
              pOVar8 = &layer->super_ON_ModelComponent;
              pOVar9 = &layer->super_ON_ModelComponent;
              pOVar10 = &layer->super_ON_ModelComponent;
              pOVar11 = &layer->super_ON_ModelComponent;
              pOVar12 = &layer->super_ON_ModelComponent;
              pOVar13 = &layer->super_ON_ModelComponent;
              pOVar14 = &layer->super_ON_ModelComponent;
              pOVar15 = &layer->super_ON_ModelComponent;
              pOVar16 = &layer->super_ON_ModelComponent;
              pOVar17 = &layer->super_ON_ModelComponent;
              layer = (ON_Layer *)&(layer->super_ON_ModelComponent).m_linked_idef_serial_number;
              auVar25[0] = -((char)pOVar2->m_linked_idef_serial_number == (char)local_40);
              auVar25[1] = -(*(char *)((long)&pOVar3->m_linked_idef_serial_number + 1) ==
                            local_40._1_1_);
              auVar25[2] = -(*(char *)((long)&pOVar4->m_linked_idef_serial_number + 2) ==
                            local_40._2_1_);
              auVar25[3] = -(*(char *)((long)&pOVar5->m_linked_idef_serial_number + 3) ==
                            local_40._3_1_);
              auVar25[4] = -(pOVar6->m_component_type == local_40._4_1_);
              auVar25[5] = -(pOVar7->field_0x2d == local_40._5_1_);
              auVar25[6] = -((char)pOVar8->m_locked_status == local_40._6_1_);
              auVar25[7] = -(*(char *)((long)&pOVar9->m_locked_status + 1) == local_40._7_1_);
              auVar25[8] = -((uchar)pOVar10->m_set_status == auStack_38[0]);
              auVar25[9] = -(*(uchar *)((long)&pOVar11->m_set_status + 1) == auStack_38[1]);
              auVar25[10] = -((pOVar12->m_component_status).m_status_flags == auStack_38[2]);
              auVar25[0xb] = -((pOVar13->m_component_status).m_mark_bits == auStack_38[3]);
              auVar25[0xc] = -((uchar)pOVar14->m_reserved2 == auStack_38[4]);
              auVar25[0xd] = -(*(uchar *)((long)&pOVar15->m_reserved2 + 1) == auStack_38[5]);
              auVar25[0xe] = -(pOVar16->field_0x36 == auStack_38[6]);
              auVar25[0xf] = -(pOVar17->field_0x37 == auStack_38[7]);
              uVar20 = uVar21 + 1;
            } while ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
            bVar18 = uVar22 <= uVar21;
          }
        }
      }
    }
LAB_004c633f:
    if (bVar18 == false) {
      return (ON__LayerPerViewSettings *)layer;
    }
  }
  return (ON__LayerPerViewSettings *)0x0;
}

Assistant:

ON__LayerPerViewSettings* ON__LayerExtensions::ViewportSettings( 
  const ON_Layer& layer,
  const unsigned char* layer_m_extension_bits,
  ON_UUID viewport_id,
  bool bCreate
  )
{
  if ( !ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(layer,layer_m_extension_bits,bCreate);
    if ( ud )
    {
      int i;
      const int vp_settings_count = ud->m_vp_settings.Count();
      ON__LayerPerViewSettings* vp_settings = ud->m_vp_settings.Array();
      for ( i = 0; i < vp_settings_count; i++ )
      {
        if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
          return (vp_settings+i);
      }
      if ( bCreate )
      {
        ON__LayerPerViewSettings& new_vp_settings = ud->m_vp_settings.AppendNew();
        vp_settings = ud->m_vp_settings.Array(); // appending can grow the array
        new_vp_settings.SetDefaultValues();
        new_vp_settings.m_viewport_id = viewport_id;

        // to make ON_Layer::PerViewportSettingsCRC() return
        // equal values for equal settings, it is critical
        // that m_vp_settings[] be sorted.
        ud->m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

        for ( i = 0; i <= vp_settings_count; i++ ) // "i <= ..." is correct because of the .AppendNew()
        {
          if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
            return (vp_settings+i);
        }
      }
    }
  }
  return 0;
}